

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O1

bool Json::parseFromStream(Factory *fact,IStream *sin,Value *root,String *errs)

{
  undefined1 uVar1;
  int iVar2;
  undefined4 extraout_var;
  String doc;
  OStringStream ssin;
  long *local_1c0;
  long local_1b8;
  long local_1b0 [2];
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  long *plVar3;
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::ostream::operator<<
            (local_1a0,*(streambuf **)(&sin->field_0xe8 + (long)sin->_vptr_basic_istream[-3]));
  std::__cxx11::stringbuf::str();
  iVar2 = (*fact->_vptr_Factory[2])(fact);
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  uVar1 = (**(code **)(*plVar3 + 0x10))(plVar3,local_1c0,local_1b8 + (long)local_1c0,root,errs);
  (**(code **)(*plVar3 + 8))(plVar3);
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0,local_1b0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  return (bool)uVar1;
}

Assistant:

bool parseFromStream(CharReader::Factory const& fact, IStream& sin, Value* root,
                     String* errs) {
  OStringStream ssin;
  ssin << sin.rdbuf();
  String doc = ssin.str();
  char const* begin = doc.data();
  char const* end = begin + doc.size();
  // Note that we do not actually need a null-terminator.
  CharReaderPtr const reader(fact.newCharReader());
  return reader->parse(begin, end, root, errs);
}